

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O3

void CorUnix::MTX_InternalLeaveCriticalSection
               (CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  int iVar1;
  HANDLE pVVar2;
  char *callingFuncName;
  
  callingFuncName = (char *)pCriticalSection;
  if (pCriticalSection->dwInitState == 0) {
    fprintf(_stderr,"] %s %s:%d","MTX_InternalLeaveCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x601);
    callingFuncName = "Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n";
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar2 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,callingFuncName);
  if (pVVar2 != pCriticalSection->OwningThread) {
    fprintf(_stderr,"] %s %s:%d","MTX_InternalLeaveCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x604);
    fprintf(_stderr,"Expression: threadId == pPalCriticalSection->OwningThread\n");
  }
  iVar1 = pCriticalSection->RecursionCount;
  if (iVar1 < 1) {
    DebugBreak();
    iVar1 = pCriticalSection->RecursionCount;
    if (iVar1 < 1) {
      fprintf(_stderr,"] %s %s:%d","MTX_InternalLeaveCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x609);
      fprintf(_stderr,"Expression: 0 < pPalCriticalSection->RecursionCount\n");
      iVar1 = pCriticalSection->RecursionCount;
    }
  }
  pCriticalSection->RecursionCount = iVar1 + -1;
  if (iVar1 + -1 < 1) {
    pCriticalSection->OwningThread = (HANDLE)0x0;
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&pCriticalSection->csnds);
    if (iVar1 != 0) {
      fprintf(_stderr,"] %s %s:%d","MTX_InternalLeaveCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x612);
      fprintf(_stderr,"Expression: 0 == iRet\n");
      return;
    }
  }
  return;
}

Assistant:

void MTX_InternalLeaveCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
#endif // MUTEX_BASED_CSS
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);
        int iRet;
#ifdef _DEBUG
        SIZE_T threadId;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);
        _ASSERTE(threadId == pPalCriticalSection->OwningThread);

        if (0 >= pPalCriticalSection->RecursionCount)
            DebugBreak();

        _ASSERTE(0 < pPalCriticalSection->RecursionCount);
#endif // _DEBUG

        if (0 < --pPalCriticalSection->RecursionCount)
            return;

        pPalCriticalSection->OwningThread = 0;

        iRet = pthread_mutex_unlock(&pPalCriticalSection->csndNativeData.mutex);
        _ASSERTE(0 == iRet);
    }